

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_Expand::Run(void)

{
  bool bVar1;
  int iVar2;
  Template *pTVar3;
  char *pcVar4;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [8];
  string output;
  TemplateString local_d8;
  TemplateDictionary local_b8 [8];
  TemplateDictionary dict;
  allocator local_31;
  string local_30 [32];
  Template *local_10;
  Template *tpl;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"hi",&local_31);
  pTVar3 = ctemplate::StringToTemplate((string *)local_30,STRIP_WHITESPACE);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = pTVar3;
  ctemplate::TemplateString::TemplateString(&local_d8,"test_expand");
  ctemplate::TemplateDictionary::TemplateDictionary(local_b8,&local_d8,(UnsafeArena *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"premade",&local_f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar1 = ctemplate::Template::Expand
                    (local_10,(string *)local_f8,(TemplateDictionaryInterface *)local_b8);
  if (!bVar1) {
    printf("ASSERT FAILED, line %d: %s\n",0x412,"tpl->Expand(&output, &dict)");
    bVar1 = ctemplate::Template::Expand
                      (local_10,(string *)local_f8,(TemplateDictionaryInterface *)local_b8);
    if (!bVar1) {
      __assert_fail("tpl->Expand(&output, &dict)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x412,"static void Test_Template_Expand::Run()");
    }
    exit(1);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar4,"premadehi");
  if (iVar2 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x413,"strcmp(output.c_str(), \"premadehi\") == 0");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp(pcVar4,"premadehi");
    if (iVar2 == 0) {
      exit(1);
    }
    __assert_fail("strcmp(output.c_str(), \"premadehi\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x413,"static void Test_Template_Expand::Run()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"   lo   ",&local_121);
  local_10 = ctemplate::StringToTemplate((string *)local_120,STRIP_WHITESPACE);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  bVar1 = ctemplate::Template::Expand
                    (local_10,(string *)local_f8,(TemplateDictionaryInterface *)local_b8);
  if (!bVar1) {
    printf("ASSERT FAILED, line %d: %s\n",0x416,"tpl->Expand(&output, &dict)");
    bVar1 = ctemplate::Template::Expand
                      (local_10,(string *)local_f8,(TemplateDictionaryInterface *)local_b8);
    if (!bVar1) {
      __assert_fail("tpl->Expand(&output, &dict)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x416,"static void Test_Template_Expand::Run()");
    }
    exit(1);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar4,"premadehilo");
  if (iVar2 == 0) {
    std::__cxx11::string::~string(local_f8);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_b8);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x417,"strcmp(output.c_str(), \"premadehilo\") == 0");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar4,"premadehilo");
  if (iVar2 == 0) {
    exit(1);
  }
  __assert_fail("strcmp(output.c_str(), \"premadehilo\") == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0x417,"static void Test_Template_Expand::Run()");
}

Assistant:

TEST(Template, Expand) {
  Template* tpl = StringToTemplate("hi", STRIP_WHITESPACE);
  TemplateDictionary dict("test_expand");
  string output("premade");
  ASSERT(tpl->Expand(&output, &dict));
  ASSERT_STREQ(output.c_str(), "premadehi");

  tpl = StringToTemplate("   lo   ", STRIP_WHITESPACE);
  ASSERT(tpl->Expand(&output, &dict));
  ASSERT_STREQ(output.c_str(), "premadehilo");
}